

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

Value * __thiscall
vkt::shaderexecutor::DefaultSampling<tcu::Matrix<float,_4,_3>_>::genRandom
          (Value *__return_storage_ptr__,DefaultSampling<tcu::Matrix<float,_4,_3>_> *this,
          FloatFormat *fmt,Precision prec,Random *rnd)

{
  Vector<float,_4> *pVVar1;
  long lVar2;
  float *pfVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 extraout_RDX;
  long lVar6;
  Value *this_00;
  int rowNdx;
  float fVar7;
  undefined4 uVar8;
  
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  pVVar1 = (__return_storage_ptr__->m_data).m_data;
  pVVar1[2].m_data[2] = 0.0;
  pVVar1[2].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  pVVar1 = (__return_storage_ptr__->m_data).m_data;
  pVVar1[1].m_data[2] = 0.0;
  pVVar1[1].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  lVar2 = 0;
  lVar4 = 0;
  pfVar3 = (float *)__return_storage_ptr__;
  do {
    lVar6 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar2 != lVar6) {
        uVar8 = 0;
      }
      *(undefined4 *)((long)pfVar3 + lVar6) = uVar8;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x30);
    lVar4 = lVar4 + 1;
    pfVar3 = pfVar3 + 1;
    lVar2 = lVar2 + 0x10;
  } while (lVar4 != 4);
  lVar2 = 0;
  uVar5 = 4;
  this_00 = __return_storage_ptr__;
  pfVar3 = (float *)__return_storage_ptr__;
  do {
    lVar4 = -0x30;
    do {
      fVar7 = DefaultSampling<float>::genRandom
                        ((DefaultSampling<float> *)this_00,fmt,(Precision)uVar5,rnd);
      *(float *)((long)pfVar3 + lVar4 + 0x30) = fVar7;
      lVar4 = lVar4 + 0x10;
      uVar5 = extraout_RDX;
    } while (lVar4 != 0);
    lVar2 = lVar2 + 1;
    pfVar3 = pfVar3 + 1;
  } while (lVar2 != 4);
  return __return_storage_ptr__;
}

Assistant:

Value	genRandom	(const FloatFormat& fmt, Precision prec, Random& rnd) const
	{
		Value ret;

		for (int rowNdx = 0; rowNdx < Rows; ++rowNdx)
			for (int colNdx = 0; colNdx < Columns; ++colNdx)
				ret(rowNdx, colNdx) = instance<DefaultSampling<T> >().genRandom(fmt, prec, rnd);

		return ret;
	}